

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_scan.hpp
# Opt level: O0

int * Omega_h::transform_inclusive_scan<int*,int*,Omega_h::maximum<int>,Omega_h::identity<int>>
                (int *first,long last,int *result)

{
  long lVar1;
  int local_8c;
  long local_88;
  d_t i;
  int value;
  type transform_local;
  long n;
  identity<int> *transform_local_1;
  int *result_local;
  int *last_local;
  int *first_local;
  int *local_48;
  
  lVar1 = last - (long)first >> 2;
  local_48 = result;
  if (0 < lVar1) {
    entering_parallel = 0;
    i._0_4_ = *first;
    *result = (int)i;
    for (local_88 = 1; local_88 < lVar1; local_88 = local_88 + 1) {
      if ((int)i < first[local_88]) {
        local_8c = first[local_88];
      }
      else {
        local_8c = (int)i;
      }
      i._0_4_ = local_8c;
      result[local_88] = local_8c;
    }
    local_48 = result + lVar1;
  }
  return local_48;
}

Assistant:

OutputIterator transform_inclusive_scan(InputIterator first, InputIterator last,
    OutputIterator result, BinaryOp op, UnaryOp&& transform) {
  auto const n = last - first;
  if (n <= 0) return result;
  Omega_h::entering_parallel = true;
  auto const transform_local = std::move(transform);
  Omega_h::entering_parallel = false;
  auto value = transform_local(first[0]);
  result[0] = value;
  using d_t = typename std::remove_const<decltype(n)>::type;
  for (d_t i = 1; i < n; ++i) {
    value = op(std::move(value), transform_local(first[i]));
    result[i] = value;
  }
  return result + n;
}